

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t inlen;
  size_t sVar9;
  
  if (len == 0) {
    return 0;
  }
  do {
    inlen = 0x4000;
    if (len < 0x4000) {
      inlen = len;
    }
    iVar5 = ptls_buffer_reserve(buf,3);
    if (iVar5 == 0) {
      puVar2 = buf->base;
      sVar9 = buf->off;
      puVar1 = puVar2 + sVar9;
      puVar1[0] = '\x17';
      puVar1[1] = '\x03';
      puVar2[sVar9 + 2] = '\x03';
      buf->off = buf->off + 3;
      iVar5 = 0;
    }
    bVar3 = true;
    if (iVar5 == 0) {
      iVar5 = ptls_buffer_reserve(buf,2);
      if (iVar5 == 0) {
        puVar1 = buf->base;
        sVar9 = buf->off;
        (puVar1 + sVar9)[0] = '\0';
        (puVar1 + sVar9)[1] = '\0';
        buf->off = buf->off + 2;
        iVar5 = 0;
      }
      bVar3 = true;
      if (iVar5 == 0) {
        sVar9 = buf->off;
        iVar5 = ptls_buffer_reserve(buf,enc->aead->algo->tag_size + inlen + 1);
        if (iVar5 == 0) {
          sVar6 = aead_encrypt(enc,buf->base + buf->off,src,inlen,type);
          sVar6 = sVar6 + buf->off;
          buf->off = sVar6;
          uVar7 = sVar6 - sVar9;
          lVar8 = 8;
          do {
            buf->base[sVar9 - 2] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
            lVar8 = lVar8 + -8;
            sVar9 = sVar9 + 1;
          } while (lVar8 != -8);
          bVar4 = true;
          iVar5 = 0;
          bVar3 = false;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = false;
      }
      if (bVar4) {
        src = src + inlen;
        len = len - inlen;
        bVar3 = false;
      }
    }
  } while ((!bVar3) && (len != 0));
  return iVar5;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(buf, chunk_size + enc->aead->algo->tag_size + 1)) != 0)
                goto Exit;
            buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
        });
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}